

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2closest_edge_query_base.h
# Opt level: O0

Result __thiscall
S2ClosestEdgeQueryBase<S2MinDistance>::FindClosestEdge
          (S2ClosestEdgeQueryBase<S2MinDistance> *this,Target *target,Options *options)

{
  int iVar1;
  ostream *poVar2;
  S2LogMessage local_48;
  S2LogMessageVoidify local_31;
  Options *local_30;
  Options *options_local;
  Target *target_local;
  S2ClosestEdgeQueryBase<S2MinDistance> *this_local;
  
  local_30 = options;
  options_local = (Options *)target;
  target_local = (Target *)this;
  iVar1 = Options::max_results(options);
  if (iVar1 == 1) {
    FindClosestEdgesInternal(this,(Target *)options_local,local_30);
    return this->result_singleton_;
  }
  S2FatalLogMessage::S2FatalLogMessage
            ((S2FatalLogMessage *)&local_48,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2closest_edge_query_base.h"
             ,0x20b,kFatal,(ostream *)&std::cerr);
  poVar2 = S2LogMessage::stream(&local_48);
  poVar2 = std::operator<<(poVar2,"Check failed: (options.max_results()) == (1) ");
  S2LogMessageVoidify::operator&(&local_31,poVar2);
  S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_48);
}

Assistant:

typename S2ClosestEdgeQueryBase<Distance>::Result
S2ClosestEdgeQueryBase<Distance>::FindClosestEdge(Target* target,
                                                  const Options& options) {
  S2_DCHECK_EQ(options.max_results(), 1);
  FindClosestEdgesInternal(target, options);
  return result_singleton_;
}